

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O1

void __thiscall
stateObservation::ZeroDelayObserver::setCurrentState(ZeroDelayObserver *this,StateVector *x_k)

{
  Matrix<double,__1,_1,_0,__1,_1> *this_00;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  int iVar7;
  Index size;
  Index index;
  ulong uVar8;
  long lVar9;
  
  if ((this->x_).super_DebugItem<bool,_stateObservation::DebugItemDefaultValue<bool,_true>,_true>.b_
      == false) {
    __assert_fail("x_.isSet() && \"The state vector has not been set\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x22,
                  "virtual void stateObservation::ZeroDelayObserver::setCurrentState(const ObserverBase::StateVector &)"
                 );
  }
  iVar7 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x14])();
  if ((char)iVar7 == '\0') {
    __assert_fail("checkStateVector(x_k) && \"The size of the state vector is incorrect\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x23,
                  "virtual void stateObservation::ZeroDelayObserver::setCurrentState(const ObserverBase::StateVector &)"
                 );
  }
  if ((this->x_).super_DebugItem<bool,_stateObservation::DebugItemDefaultValue<bool,_true>,_true>.b_
      == false) {
    __assert_fail("isSet() && \"Error: Matrix not initialized, if you are initializing it,                             use set() function.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                  ,0xd6,
                  "bool stateObservation::IndexedMatrixT<Eigen::Matrix<double, -1, 1>>::check_() const [MatrixType = Eigen::Matrix<double, -1, 1>, lazy = false]"
                 );
  }
  this_00 = &(this->x_).v_;
  pdVar3 = (x_k->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar8 = (x_k->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != uVar8) {
    if ((long)uVar8 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this_00,uVar8,uVar8,1);
  }
  uVar4 = (this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (uVar4 == uVar8) {
    pdVar5 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar8 = uVar4 - ((long)uVar4 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar4) {
      lVar9 = 0;
      do {
        pdVar1 = pdVar3 + lVar9;
        dVar6 = pdVar1[1];
        pdVar2 = pdVar5 + lVar9;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar6;
        lVar9 = lVar9 + 2;
      } while (lVar9 < (long)uVar8);
    }
    if ((long)uVar8 < (long)uVar4) {
      do {
        pdVar5[uVar8] = pdVar3[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
               );
}

Assistant:

void ZeroDelayObserver::setCurrentState(const ObserverBase::StateVector & x_k)
{
  BOOST_ASSERT(x_.isSet() && "The state vector has not been set");
  BOOST_ASSERT(checkStateVector(x_k) && "The size of the state vector is incorrect");

  x_() = x_k;
}